

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O3

QString * double2string(QString *__return_storage_ptr__,double num,int base,int ndigits,bool *oflow)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  Data *pDVar4;
  uint uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QString local_58;
  QString *local_38;
  
  local_38 = *(QString **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (base == 1) {
    uVar5 = ndigits;
    do {
      QString::asprintf((char *)&local_58,SUB84(num,0),"%*.*g",(ulong)(uint)ndigits,(ulong)uVar5);
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar3 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_58.d.d;
      (__return_storage_ptr__->d).ptr = local_58.d.ptr;
      qVar2 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_58.d.size;
      local_58.d.size = qVar2;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          local_58.d.d = (Data *)pQVar1;
          local_58.d.ptr = pcVar3;
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      local_58.d.ptr = (__return_storage_ptr__->d).ptr;
      local_58.d.d = (Data *)(__return_storage_ptr__->d).size;
      qVar2 = QStringView::indexOf((QStringView *)&local_58,(QChar)0x65,0,CaseSensitive);
      if (0 < qVar2) {
        pDVar4 = (__return_storage_ptr__->d).d;
        if ((pDVar4 == (Data *)0x0) ||
           (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData
                    ((longlong)__return_storage_ptr__,
                     (AllocationOption)(__return_storage_ptr__->d).size);
        }
        pcVar3 = (__return_storage_ptr__->d).ptr;
        if (pcVar3[qVar2 + 1] == L'+') {
          pDVar4 = (__return_storage_ptr__->d).d;
          if ((pDVar4 == (Data *)0x0) ||
             (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QString::reallocData
                      ((longlong)__return_storage_ptr__,
                       (AllocationOption)(__return_storage_ptr__->d).size);
            pDVar4 = (__return_storage_ptr__->d).d;
            pcVar3 = (__return_storage_ptr__->d).ptr;
            pcVar3[qVar2] = L' ';
            if (pDVar4 != (Data *)0x0) goto LAB_00414558;
LAB_0041455f:
            QString::reallocData
                      ((longlong)__return_storage_ptr__,
                       (AllocationOption)(__return_storage_ptr__->d).size);
            pcVar3 = (__return_storage_ptr__->d).ptr;
          }
          else {
            pcVar3[qVar2] = L' ';
LAB_00414558:
            if (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)
            goto LAB_0041455f;
          }
          pcVar3[qVar2 + 1] = L'e';
        }
      }
      bVar6 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while ((bVar6) && (ndigits < (int)(__return_storage_ptr__->d).size));
    if (oflow == (bool *)0x0) goto LAB_004145f7;
    qVar2 = (__return_storage_ptr__->d).size;
LAB_004145e6:
    bVar6 = ndigits < (int)qVar2;
  }
  else {
    if ((num < 2147483648.0) && (-2147483648.0 <= num)) {
      int2string(&local_58,(int)num,base,ndigits,(bool *)0x0);
      *(undefined4 *)&(__return_storage_ptr__->d).d = local_58.d.d._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_58.d.d._4_4_;
      *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_58.d.ptr._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_58.d.ptr._4_4_;
      (__return_storage_ptr__->d).size = local_58.d.size;
      qVar2 = local_58.d.size;
      if (oflow == (bool *)0x0) goto LAB_004145f7;
      goto LAB_004145e6;
    }
    bVar6 = true;
    if (oflow == (bool *)0x0) goto LAB_004145f7;
  }
  *oflow = bVar6;
LAB_004145f7:
  if (*(QString **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(QString **)(in_FS_OFFSET + 0x28);
}

Assistant:

static QString double2string(double num, int base, int ndigits, bool *oflow)
{
    QString s;
    if (base != QLCDNumber::Dec) {
        bool of = num >= 2147483648.0 || num < -2147483648.0;
        if (of) {                             // oops, integer overflow
            if (oflow)
                *oflow = true;
            return s;
        }
        s = int2string((int)num, base, ndigits, nullptr);
    } else {                                    // decimal base
        int nd = ndigits;
        do {
            s = QString::asprintf("%*.*g", ndigits, nd, num);
            qsizetype i = s.indexOf(u'e');
            if (i > 0 && s[i+1]==u'+') {
                s[i] = u' ';
                s[i+1] = u'e';
            }
        } while (nd-- && (int)s.size() > ndigits);
    }
    if (oflow)
        *oflow = (int)s.size() > ndigits;
    return s;
}